

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestRedactedMessage::_InternalSerialize
          (TestRedactedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  Any *value;
  TestRedactedMessage *pTVar1;
  bool bVar2;
  int iVar3;
  uint32_t *puVar4;
  char *pcVar5;
  UnknownFieldSet *unknown_fields;
  string_view sVar6;
  string_view local_188;
  string *local_178;
  string *_s_8;
  char *local_168;
  string_view local_160;
  string *local_150;
  string *_s_7;
  char *local_140;
  string_view local_138;
  string *local_128;
  string *_s_6;
  char *local_118;
  string_view local_110;
  string *local_100;
  string *_s_5;
  char *local_f0;
  string_view local_e8;
  string *local_d8;
  string *_s_4;
  char *local_c8;
  string_view local_c0;
  string *local_b0;
  string *_s_3;
  char *local_a0;
  string_view local_98;
  string *local_88;
  string *_s_2;
  char *local_78;
  string_view local_70;
  string *local_60;
  string *_s_1;
  char *local_50;
  string_view local_48;
  string *local_38;
  string *_s;
  TestRedactedMessage *pTStack_28;
  uint32_t cached_has_bits;
  TestRedactedMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestRedactedMessage *this_local;
  
  _s._4_4_ = 0;
  pTStack_28 = this;
  this_ = (TestRedactedMessage *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar4;
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_text_field_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"proto2_unittest.TestRedactedMessage.text_field");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_48);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_50 = sVar6._M_str;
    _s_1 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,1,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    local_60 = _internal_meta_annotated_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,"proto2_unittest.TestRedactedMessage.meta_annotated");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_70);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_78 = sVar6._M_str;
    _s_2 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,8,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 4) != 0) {
    local_88 = _internal_repeated_meta_annotated_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"proto2_unittest.TestRedactedMessage.repeated_meta_annotated");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_98);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    local_a0 = sVar6._M_str;
    _s_3 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,9,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    local_b0 = _internal_unredacted_repeated_annotations_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_c0,"proto2_unittest.TestRedactedMessage.unredacted_repeated_annotations");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_c0);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b0);
    local_c8 = sVar6._M_str;
    _s_4 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,10,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x10) != 0) {
    local_d8 = _internal_unreported_non_meta_debug_redact_field_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e8,
               "proto2_unittest.TestRedactedMessage.unreported_non_meta_debug_redact_field");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_e8);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
    local_f0 = sVar6._M_str;
    _s_5 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,0x11,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x200) != 0) {
    value = (pTStack_28->field_0)._impl_.any_field_;
    iVar3 = google::protobuf::Any::GetCachedSize((pTStack_28->field_0)._impl_.any_field_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x12,(MessageLite *)value,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 0x20) != 0) {
    local_100 = _internal_redactable_false_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_110,"proto2_unittest.TestRedactedMessage.redactable_false");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_110);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
    local_118 = sVar6._M_str;
    _s_6 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,0x13,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x40) != 0) {
    local_128 = _internal_test_direct_message_enum_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_138,"proto2_unittest.TestRedactedMessage.test_direct_message_enum");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_138);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_128);
    local_140 = sVar6._M_str;
    _s_7 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,0x16,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x80) != 0) {
    local_150 = _internal_test_nested_message_enum_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_160,"proto2_unittest.TestRedactedMessage.test_nested_message_enum");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_160);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_150);
    local_168 = sVar6._M_str;
    _s_8 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,0x17,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x100) != 0) {
    local_178 = _internal_test_redacted_message_enum_abi_cxx11_(pTStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_188,"proto2_unittest.TestRedactedMessage.test_redacted_message_enum");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,local_188);
    pTVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_178);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar1,0x18,sVar6,(uint8_t *)stream_local);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(pTStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pTStack_28->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRedactedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRedactedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRedactedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // string text_field = 1 [deprecated = true];
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_text_field();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.text_field");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // string meta_annotated = 8 [(.proto2_unittest.meta_annotated_enum) = TEST_REDACTABLE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_meta_annotated();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.meta_annotated");
    target = stream->WriteStringMaybeAliased(8, _s, target);
  }

  // string repeated_meta_annotated = 9 [(.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT, (.proto2_unittest.repeated_meta_annotated_enum) = TEST_REDACTABLE];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_repeated_meta_annotated();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.repeated_meta_annotated");
    target = stream->WriteStringMaybeAliased(9, _s, target);
  }

  // string unredacted_repeated_annotations = 10 [(.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT, (.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT_AGAIN];
  if ((cached_has_bits & 0x00000008u) != 0) {
    const ::std::string& _s = this_._internal_unredacted_repeated_annotations();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.unredacted_repeated_annotations");
    target = stream->WriteStringMaybeAliased(10, _s, target);
  }

  // string unreported_non_meta_debug_redact_field = 17 [debug_redact = true];
  if ((cached_has_bits & 0x00000010u) != 0) {
    const ::std::string& _s = this_._internal_unreported_non_meta_debug_redact_field();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.unreported_non_meta_debug_redact_field");
    target = stream->WriteStringMaybeAliased(17, _s, target);
  }

  // .google.protobuf.Any any_field = 18 [debug_redact = true];
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        18, *this_._impl_.any_field_, this_._impl_.any_field_->GetCachedSize(), target,
        stream);
  }

  // string redactable_false = 19 [(.proto2_unittest.meta_annotated_enum) = TEST_REDACTABLE_FALSE];
  if ((cached_has_bits & 0x00000020u) != 0) {
    const ::std::string& _s = this_._internal_redactable_false();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.redactable_false");
    target = stream->WriteStringMaybeAliased(19, _s, target);
  }

  // string test_direct_message_enum = 22 [(.proto2_unittest.test_nested_message_enum) = {
  if ((cached_has_bits & 0x00000040u) != 0) {
    const ::std::string& _s = this_._internal_test_direct_message_enum();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.test_direct_message_enum");
    target = stream->WriteStringMaybeAliased(22, _s, target);
  }

  // string test_nested_message_enum = 23 [(.proto2_unittest.test_nested_message_enum) = {
  if ((cached_has_bits & 0x00000080u) != 0) {
    const ::std::string& _s = this_._internal_test_nested_message_enum();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.test_nested_message_enum");
    target = stream->WriteStringMaybeAliased(23, _s, target);
  }

  // string test_redacted_message_enum = 24 [(.proto2_unittest.test_nested_message_enum) = {
  if ((cached_has_bits & 0x00000100u) != 0) {
    const ::std::string& _s = this_._internal_test_redacted_message_enum();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestRedactedMessage.test_redacted_message_enum");
    target = stream->WriteStringMaybeAliased(24, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRedactedMessage)
  return target;
}